

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
TextReaderTest_InvalidNumOptions_Test::TestBody(TextReaderTest_InvalidNumOptions_Test *this)

{
  StringRef line;
  bool bVar1;
  char *pcVar2;
  StringRef line_00;
  StringRef line_01;
  StringRef line_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_3;
  uint local_12c;
  NLHeader local_128;
  
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  line_00.size_ = 2;
  line_00.data_ = "ga";
  ReadHeader(&local_128,0,line_00);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","ReadHeader(0, \"ga\").num_ampl_options",(int *)&gtest_ar_2,
             &local_128.super_NLInfo.super_NLInfo_C.num_ampl_options);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0xe3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_128);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  line_01.size_ = 3;
  line_01.data_ = "g-1";
  ReadHeader(&local_128,0,line_01);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","ReadHeader(0, \"g-1\").num_ampl_options",(int *)&gtest_ar_2,
             &local_128.super_NLInfo.super_NLInfo_C.num_ampl_options);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_128);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_2.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"(input):1:2: too many options",(allocator<char> *)&local_128);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      line_02.size_ = 3;
      line_02.data_ = "g10";
      ReadHeader(&local_128,0,line_02);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_2,
               (char (*) [99])
               "Expected: ReadHeader(0, \"g10\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&local_128);
  if (gtest_ar_2.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xe6,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  testing::AssertionSuccess();
  if (gtest_ar_3.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"(input):1:2: number is too big",(allocator<char> *)&local_128);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_12c = 0x80000000;
      fmt::format<unsigned_int>((string *)&gtest_ar_2,(CStringRef)0x20f4fd,&local_12c);
      line.data_._4_4_ = gtest_ar_2._4_4_;
      line.data_._0_1_ = gtest_ar_2.success_;
      line.data_._1_3_ = gtest_ar_2._1_3_;
      line.size_ = (size_t)gtest_ar_2.message_.ptr_;
      ReadHeader(&local_128,0,line);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_3,
               (char (*) [151])
               "Expected: ReadHeader(0, fmt::format(\"g{}\", static_cast<unsigned>(2147483647) + 1)) throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&local_128);
  if (gtest_ar_3.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xe9,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(TextReaderTest, InvalidNumOptions) {
  EXPECT_EQ(0, ReadHeader(0, "ga").num_ampl_options);
  EXPECT_EQ(0, ReadHeader(0, "g-1").num_ampl_options);
  EXPECT_THROW_MSG(ReadHeader(0, "g10"),
      ReadError, "(input):1:2: too many options");
  EXPECT_THROW_MSG(ReadHeader(0,
      fmt::format("g{}", static_cast<unsigned>(INT_MAX) + 1)),
      ReadError, "(input):1:2: number is too big");
}